

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O3

int Cnf_DataWriteAndClauses(void *p,Cnf_Dat_t *pCnf)

{
  int iVar1;
  undefined8 in_RAX;
  Vec_Ptr_t *pVVar2;
  long lVar3;
  int Lit;
  undefined8 uStack_38;
  
  pVVar2 = pCnf->pMan->vCos;
  if (0 < pVVar2->nSize) {
    lVar3 = 0;
    uStack_38 = in_RAX;
    do {
      uStack_38 = CONCAT44(pCnf->pVarNums[*(int *)((long)pVVar2->pArray[lVar3] + 0x24)] * 2,
                           (undefined4)uStack_38);
      iVar1 = sat_solver_addclause
                        ((sat_solver *)p,(lit *)((long)&uStack_38 + 4),
                         (lit *)&stack0xffffffffffffffd0);
      if (iVar1 == 0) {
        return 0;
      }
      lVar3 = lVar3 + 1;
      pVVar2 = pCnf->pMan->vCos;
    } while (lVar3 < pVVar2->nSize);
  }
  return 1;
}

Assistant:

int Cnf_DataWriteAndClauses( void * p, Cnf_Dat_t * pCnf )
{
    sat_solver * pSat = (sat_solver *)p;
    Aig_Obj_t * pObj;
    int i, Lit;
    Aig_ManForEachCo( pCnf->pMan, pObj, i )
    {
        Lit = toLitCond( pCnf->pVarNums[pObj->Id], 0 );
        if ( !sat_solver_addclause( pSat, &Lit, &Lit+1 ) )
            return 0;
    }
    return 1;
}